

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-graph.cpp
# Opt level: O1

void __thiscall
llm_graph_context::llm_graph_context(llm_graph_context *this,llm_graph_params *params)

{
  undefined4 uVar1;
  undefined4 uVar2;
  ulong uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  uint uVar6;
  llama_hparams *plVar7;
  llama_cparams *plVar8;
  undefined1 auVar9 [16];
  float fVar10;
  ggml_backend *pgVar11;
  llama_adapter_loras *plVar12;
  llama_cross *plVar13;
  uint32_t uVar14;
  llm_graph_result *plVar15;
  
  this->arch = params->arch;
  plVar7 = params->hparams;
  this->hparams = plVar7;
  plVar8 = params->cparams;
  this->cparams = plVar8;
  this->ubatch = params->ubatch;
  this->n_embd = (ulong)plVar7->n_embd;
  uVar3._0_4_ = plVar7->n_layer;
  uVar3._4_4_ = plVar7->n_rot;
  auVar9._8_4_ = uVar3._4_4_;
  auVar9._0_8_ = uVar3 & 0xffffffff;
  auVar9._12_4_ = 0;
  this->n_layer = uVar3 & 0xffffffff;
  this->n_rot = auVar9._8_8_;
  uVar6 = plVar8->n_ctx;
  this->n_ctx = (ulong)uVar6;
  this->n_ctx_per_seq = (ulong)uVar6 / (ulong)plVar8->n_seq_max;
  uVar14 = llama_hparams::n_head(plVar7,0);
  this->n_head = (ulong)uVar14;
  uVar14 = llama_hparams::n_head_kv(this->hparams,0);
  this->n_head_kv = (ulong)uVar14;
  this->n_embd_head_k = (ulong)this->hparams->n_embd_head_k;
  uVar14 = llama_hparams::n_embd_k_gqa(this->hparams,0);
  this->n_embd_k_gqa = (ulong)uVar14;
  this->n_embd_head_v = (ulong)this->hparams->n_embd_head_v;
  uVar14 = llama_hparams::n_embd_v_gqa(this->hparams,0);
  this->n_embd_v_gqa = (ulong)uVar14;
  plVar7 = this->hparams;
  plVar8 = this->cparams;
  this->n_expert = (ulong)plVar7->n_expert;
  this->n_expert_used = (ulong)(plVar7->n_head_arr)._M_elems[(ulong)(plVar8->warmup ^ 1) - 9];
  fVar10 = plVar8->rope_freq_scale;
  uVar1 = plVar8->yarn_ext_factor;
  uVar4 = plVar8->yarn_attn_factor;
  this->freq_base = plVar8->rope_freq_base;
  this->freq_scale = fVar10;
  this->ext_factor = (float)uVar1;
  this->attn_factor = (float)uVar4;
  fVar10 = plVar8->yarn_beta_slow;
  uVar2 = plVar7->f_norm_eps;
  uVar5 = plVar7->f_norm_rms_eps;
  this->beta_fast = plVar8->yarn_beta_fast;
  this->beta_slow = fVar10;
  this->norm_eps = (float)uVar2;
  this->norm_rms_eps = (float)uVar5;
  this->n_tokens = this->ubatch->n_tokens;
  this->n_outputs = params->n_outputs;
  this->n_ctx_orig = plVar8->n_ctx_orig_yarn;
  this->pooling_type = plVar8->pooling_type;
  this->rope_type = plVar7->rope_type;
  this->ctx0 = params->ctx;
  pgVar11 = params->backend_cpu;
  this->sched = params->sched;
  this->backend_cpu = pgVar11;
  plVar12 = params->loras;
  this->cvec = params->cvec;
  this->loras = plVar12;
  plVar13 = params->cross;
  this->memory = params->memory;
  this->cross = plVar13;
  this->cb_func = params->cb;
  plVar15 = (llm_graph_result *)operator_new(0x38);
  (plVar15->super_llm_graph_result_i)._vptr_llm_graph_result_i = (_func_int **)0x0;
  plVar15->t_logits = (ggml_tensor *)0x0;
  *(undefined8 *)
   &(plVar15->inputs).
    super__Vector_base<std::unique_ptr<llm_graph_input_i,_std::default_delete<llm_graph_input_i>_>,_std::allocator<std::unique_ptr<llm_graph_input_i,_std::default_delete<llm_graph_input_i>_>_>_>
    ._M_impl = 0;
  *(pointer *)
   ((long)&(plVar15->inputs).
           super__Vector_base<std::unique_ptr<llm_graph_input_i,_std::default_delete<llm_graph_input_i>_>,_std::allocator<std::unique_ptr<llm_graph_input_i,_std::default_delete<llm_graph_input_i>_>_>_>
   + 8) = (pointer)0x0;
  plVar15->t_embd = (ggml_tensor *)0x0;
  plVar15->t_embd_pooled = (ggml_tensor *)0x0;
  *(pointer *)
   ((long)&(plVar15->inputs).
           super__Vector_base<std::unique_ptr<llm_graph_input_i,_std::default_delete<llm_graph_input_i>_>,_std::allocator<std::unique_ptr<llm_graph_input_i,_std::default_delete<llm_graph_input_i>_>_>_>
   + 0x10) = (pointer)0x0;
  (plVar15->super_llm_graph_result_i)._vptr_llm_graph_result_i =
       (_func_int **)&PTR__llm_graph_result_002865f0;
  *(pointer *)
   ((long)&(plVar15->inputs).
           super__Vector_base<std::unique_ptr<llm_graph_input_i,_std::default_delete<llm_graph_input_i>_>,_std::allocator<std::unique_ptr<llm_graph_input_i,_std::default_delete<llm_graph_input_i>_>_>_>
   + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(plVar15->inputs).
           super__Vector_base<std::unique_ptr<llm_graph_input_i,_std::default_delete<llm_graph_input_i>_>,_std::allocator<std::unique_ptr<llm_graph_input_i,_std::default_delete<llm_graph_input_i>_>_>_>
   + 0x10) = (pointer)0x0;
  plVar15->t_embd_pooled = (ggml_tensor *)0x0;
  *(undefined8 *)
   &(plVar15->inputs).
    super__Vector_base<std::unique_ptr<llm_graph_input_i,_std::default_delete<llm_graph_input_i>_>,_std::allocator<std::unique_ptr<llm_graph_input_i,_std::default_delete<llm_graph_input_i>_>_>_>
    ._M_impl = 0;
  plVar15->t_logits = (ggml_tensor *)0x0;
  plVar15->t_embd = (ggml_tensor *)0x0;
  (this->res)._M_t.super___uniq_ptr_impl<llm_graph_result,_std::default_delete<llm_graph_result>_>.
  _M_t.super__Tuple_impl<0UL,_llm_graph_result_*,_std::default_delete<llm_graph_result>_>.
  super__Head_base<0UL,_llm_graph_result_*,_false>._M_head_impl = plVar15;
  return;
}

Assistant:

llm_graph_context::llm_graph_context(const llm_graph_params & params) :
    arch             (params.arch),
    hparams          (params.hparams),
    cparams          (params.cparams),
    ubatch           (params.ubatch),
    n_embd           (hparams.n_embd),
    n_layer          (hparams.n_layer),
    n_rot            (hparams.n_rot),
    n_ctx            (cparams.n_ctx),
    n_ctx_per_seq    (cparams.n_ctx / cparams.n_seq_max),
    n_head           (hparams.n_head()),
    n_head_kv        (hparams.n_head_kv()),
    n_embd_head_k    (hparams.n_embd_head_k),
    n_embd_k_gqa     (hparams.n_embd_k_gqa()),
    n_embd_head_v    (hparams.n_embd_head_v),
    n_embd_v_gqa     (hparams.n_embd_v_gqa()),
    n_expert         (hparams.n_expert),
    n_expert_used    (cparams.warmup ? hparams.n_expert : hparams.n_expert_used),
    freq_base        (cparams.rope_freq_base),
    freq_scale       (cparams.rope_freq_scale),
    ext_factor       (cparams.yarn_ext_factor),
    attn_factor      (cparams.yarn_attn_factor),
    beta_fast        (cparams.yarn_beta_fast),
    beta_slow        (cparams.yarn_beta_slow),
    norm_eps         (hparams.f_norm_eps),
    norm_rms_eps     (hparams.f_norm_rms_eps),
    n_tokens         (ubatch.n_tokens),
    n_outputs        (params.n_outputs),
    n_ctx_orig       (cparams.n_ctx_orig_yarn),
    pooling_type     (cparams.pooling_type),
    rope_type        (hparams.rope_type),
    ctx0             (params.ctx),
    sched            (params.sched),
    backend_cpu      (params.backend_cpu),
    cvec             (params.cvec),
    loras            (params.loras),
    memory           (params.memory),
    cross            (params.cross),
    cb_func          (params.cb),
    res              (std::make_unique<llm_graph_result>()) {
    }